

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFAsset.h
# Opt level: O2

void __thiscall glTF::Mesh::~Mesh(Mesh *this)

{
  list<glTF::Mesh::SExtension_*,_std::allocator<glTF::Mesh::SExtension_*>_> *this_00;
  _List_node_base *p_Var1;
  
  (this->super_Object)._vptr_Object = (_func_int **)&PTR_IsSpecial_00759108;
  this_00 = &this->Extension;
  p_Var1 = (_List_node_base *)this_00;
  while (p_Var1 = (((_List_base<glTF::Mesh::SExtension_*,_std::allocator<glTF::Mesh::SExtension_*>_>
                     *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var1 != (_List_node_base *)this_00) {
    if (p_Var1[1]._M_next != (_List_node_base *)0x0) {
      (**(code **)(*(long *)p_Var1[1]._M_next + 8))();
    }
  }
  std::__cxx11::_List_base<glTF::Mesh::SExtension_*,_std::allocator<glTF::Mesh::SExtension_*>_>::
  _M_clear(&this_00->
            super__List_base<glTF::Mesh::SExtension_*,_std::allocator<glTF::Mesh::SExtension_*>_>);
  std::vector<glTF::Mesh::Primitive,_std::allocator<glTF::Mesh::Primitive>_>::~vector
            (&this->primitives);
  Object::~Object(&this->super_Object);
  return;
}

Assistant:

~Mesh() { for(std::list<SExtension*>::iterator it = Extension.begin(), it_end = Extension.end(); it != it_end; it++) { delete *it; }; }